

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTag
          (UnknownField *this,CodedOutputStream *output)

{
  UnknownFieldSet *pUVar1;
  byte *pbVar2;
  bool bVar3;
  LogMessage *other;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint value;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->type_ != 3) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x145);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type()): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pUVar1 = (this->data_).group_;
  value = *(uint *)&pUVar1[1].fields_;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,value);
  }
  else {
    pbVar2 = output->buffer_;
    pbVar5 = pbVar2;
    uVar6 = value;
    if (0x7f < value) {
      do {
        *pbVar5 = (byte)value | 0x80;
        uVar6 = value >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < value;
        value = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar2) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  if (output->aliasing_enabled_ == true) {
    io::CodedOutputStream::WriteAliasedRaw(output,pUVar1->fields_,*(int *)&pUVar1[1].fields_);
  }
  else {
    io::CodedOutputStream::WriteRaw(output,pUVar1->fields_,*(int *)&pUVar1[1].fields_);
  }
  return;
}

Assistant:

void UnknownField::SerializeLengthDelimitedNoTag(
    io::CodedOutputStream* output) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const string& data = *data_.length_delimited_.string_value_;
  output->WriteVarint32(data.size());
  output->WriteRawMaybeAliased(data.data(), data.size());
}